

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase1816::run(TestCase1816 *this)

{
  float fVar1;
  Builder root;
  MallocMessageBuilder message;
  float local_160 [2];
  CapTableBuilder *pCStack_158;
  WirePointer *local_150;
  float local_148 [2];
  CapTableBuilder *pCStack_140;
  WirePointer *local_138;
  StructBuilder local_128;
  MallocMessageBuilder local_100;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_100,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)local_160,&local_100.super_MessageBuilder);
  local_138 = local_150;
  local_148[0] = local_160[0];
  pCStack_140 = pCStack_158;
  PointerBuilder::initStruct(&local_128,(PointerBuilder *)local_148,(StructSize)0x1);
  if ((float)(*local_128.data ^ 0x42f60000) != 123.0 && kj::_::Debug::minSeverity < 3) {
    local_148[0] = 123.0;
    local_160[0] = (float)(*local_128.data ^ 0x42f60000);
    kj::_::Debug::log<char_const(&)[47],float,float>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x71c,ERROR,
               "\"failed: expected \" \"(123.0f) == (root.getField())\", 123.0f, root.getField()",
               (char (*) [47])"failed: expected (123.0f) == (root.getField())",local_148,local_160);
  }
  fVar1 = (float)(*(uint *)((long)local_128.data + 4) ^ 0x71c9f2ca);
  if (((fVar1 != 2e+30) || (NAN(fVar1))) && (kj::_::Debug::minSeverity < 3)) {
    local_148[0] = 2e+30;
    local_160[0] = fVar1;
    kj::_::Debug::log<char_const(&)[49],float,float>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x71d,ERROR,
               "\"failed: expected \" \"(2e30f) == (root.getBigField())\", 2e30f, root.getBigField()"
               ,(char (*) [49])"failed: expected (2e30f) == (root.getBigField())",local_148,
               local_160);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_100);
  return;
}

Assistant:

TEST(Encoding, WholeFloatDefault) {
  MallocMessageBuilder message;
  auto root = message.initRoot<test::TestWholeFloatDefault>();

  EXPECT_EQ(123.0f, root.getField());
  EXPECT_EQ(2e30f, root.getBigField());
  EXPECT_EQ(456.0f, test::TestWholeFloatDefault::CONSTANT);
  EXPECT_EQ(4e30f, test::TestWholeFloatDefault::BIG_CONSTANT);
}